

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int target_set_durable(TARGET_HANDLE target,terminus_durability durable_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  TARGET_INSTANCE *target_instance;
  
  if (target == (TARGET_HANDLE)0x0) {
    iVar2 = 0x3663;
  }
  else {
    item_value = amqpvalue_create_uint(durable_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x366b;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(target->composite_value,1,item_value);
      iVar2 = 0x3671;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int target_set_durable(TARGET_HANDLE target, terminus_durability durable_value)
{
    int result;

    if (target == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target;
        AMQP_VALUE durable_amqp_value = amqpvalue_create_terminus_durability(durable_value);
        if (durable_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(target_instance->composite_value, 1, durable_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(durable_amqp_value);
        }
    }

    return result;
}